

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  int local_24;
  Abc_Obj_t *pAStack_20;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *vNodes_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsNet(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0x30d,"void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Abc_ObjIsBo(pNode);
  vNodes_local = (Vec_Ptr_t *)pNode;
  if (iVar1 != 0) {
    vNodes_local = (Vec_Ptr_t *)Abc_ObjFanin0(pNode);
  }
  iVar1 = Abc_ObjIsPi((Abc_Obj_t *)vNodes_local);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsNode((Abc_Obj_t *)vNodes_local);
    if ((iVar1 == 0) && (iVar1 = Abc_ObjIsBox((Abc_Obj_t *)vNodes_local), iVar1 == 0)) {
      __assert_fail("Abc_ObjIsNode( pNode ) || Abc_ObjIsBox( pNode )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                    ,0x312,"void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    iVar1 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)vNodes_local);
    if (iVar1 == 0) {
      Abc_NodeSetTravIdCurrent((Abc_Obj_t *)vNodes_local);
      for (local_24 = 0; iVar1 = Abc_ObjFaninNum((Abc_Obj_t *)vNodes_local), local_24 < iVar1;
          local_24 = local_24 + 1) {
        pAStack_20 = Abc_ObjFanin((Abc_Obj_t *)vNodes_local,local_24);
        iVar1 = Abc_ObjIsBox((Abc_Obj_t *)vNodes_local);
        if (iVar1 != 0) {
          pAStack_20 = Abc_ObjFanin0(pAStack_20);
        }
        iVar1 = Abc_ObjIsNet(pAStack_20);
        if (iVar1 == 0) {
          __assert_fail("Abc_ObjIsNet(pFanin)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                        ,0x31a,"void Abc_NtkDfsWithBoxes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
        }
        pNode_00 = Abc_ObjFanin0Ntk(pAStack_20);
        Abc_NtkDfsWithBoxes_rec(pNode_00,vNodes);
      }
      Vec_PtrPush(vNodes,vNodes_local);
    }
  }
  return;
}

Assistant:

void Abc_NtkDfsWithBoxes_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    assert( !Abc_ObjIsNet(pNode) );
    if ( Abc_ObjIsBo(pNode) )
        pNode = Abc_ObjFanin0(pNode);
    if ( Abc_ObjIsPi(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) || Abc_ObjIsBox( pNode ) );
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( Abc_ObjIsBox(pNode) )
            pFanin = Abc_ObjFanin0(pFanin);
        assert( Abc_ObjIsNet(pFanin) );
        Abc_NtkDfsWithBoxes_rec( Abc_ObjFanin0Ntk(pFanin), vNodes );
    }
    Vec_PtrPush( vNodes, pNode );
}